

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgFrame.c
# Opt level: O1

uint zvgFrameSend(void)

{
  uint uVar1;
  
  zvgEncEOF();
  uVar1 = zvgEncSize();
  uVar1 = zvgDmaPutMem(EncodeBfr,uVar1);
  if (uVar1 == 0) {
    zvgEncClearBfr();
    uVar1 = zvgDmaSendSwap();
    if (uVar1 == 0) {
      zvgEncSOF();
      uVar1 = zvgEncSize();
      uVar1 = zvgDmaPutMem(EncodeBfr,uVar1);
      if (uVar1 == 0) {
        zvgEncClearBfr();
        uVar1 = 0;
      }
    }
  }
  return uVar1;
}

Assistant:

uint zvgFrameSend(void)
{
	uint	err;

	// Send End of Frame info. (Center Trace, pad ZVG buffer)
	zvgEncEOF();

	err = zvgDmaPutMem( EncodeBfr, zvgEncSize());

	if (err)
		return (err);

	// wait for the end of the frame, using the timer functions
	//tmrWaitForFrame();

	zvgEncClearBfr();				// Clear the encode buffer

	// Start the DMA transfer of the encoded command in the DMA buffer to
	// the ZVG.  SCJ: NEED TO DO A "PREV SWAP!", since the "current" buffer will
	// have bupkis in it due to having no points in the frame!!!

	//if(npoints > 0)
	//{
		err = zvgDmaSendSwap();		// send the current buffer and swap DMA buffers
	//}
	//else
	//{
	//	err = zvgDmaSendPrev();		// if there are no points, send previous
	//}

	if (err)
		return (err);

	// Start next buffer with spot kill stuff if needed

	zvgEncSOF();

	err = zvgDmaPutMem( EncodeBfr, zvgEncSize());

	if (err)
		return (err);

	zvgEncClearBfr();				// Clear the encode buffer
	return (errOk);
}